

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# naviebayes.cpp
# Opt level: O3

void __thiscall NavieBayes::bayesEstim(NavieBayes *this,double *lmbda)

{
  double dVar1;
  pointer pdVar2;
  mapped_type_conflict *pmVar3;
  _Rb_tree_node_base *p_Var4;
  pointer pvVar5;
  pointer pvVar6;
  ulong uVar7;
  pointer pdVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  _Rb_tree_node_base *p_Var13;
  bool bVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  cond;
  ulong local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  key_type local_a8;
  long local_68;
  long local_60;
  double local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pdVar8 = (this->super_Base).trainDataGT.super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pdVar2 = (this->super_Base).trainDataGT.super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (pdVar8 != pdVar2) {
    do {
      __gnu_cxx::__to_xstring<std::__cxx11::string,char>
                (&local_a8.first,vsnprintf,0x148,"%f",*pdVar8);
      pmVar3 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
               ::operator[](&this->priProb,&local_a8.first);
      *pmVar3 = *pmVar3 + 1.0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8.first._M_dataplus._M_p != &local_a8.first.field_2) {
        operator_delete(local_a8.first._M_dataplus._M_p);
      }
      pdVar8 = pdVar8 + 1;
    } while (pdVar8 != pdVar2);
  }
  uVar10 = (this->super_Base).indim;
  if (uVar10 != 0) {
    pvVar5 = (this->super_Base).trainDataF.
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pvVar6 = (this->super_Base).trainDataF.
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_100 = 0;
    do {
      bVar14 = pvVar6 != pvVar5;
      pvVar6 = pvVar5;
      if (bVar14) {
        local_60 = local_100 * 3;
        local_68 = local_100 * 0x30;
        lVar9 = 0;
        uVar10 = 0;
        do {
          __gnu_cxx::__to_xstring<std::__cxx11::string,char>
                    (&local_c8,vsnprintf,0x148,"%f",
                     *(undefined8 *)
                      (*(long *)((long)&(pvVar5->super__Vector_base<double,_std::allocator<double>_>
                                        )._M_impl.super__Vector_impl_data._M_start + lVar9) +
                      local_100 * 8));
          __gnu_cxx::__to_xstring<std::__cxx11::string,char>
                    (&local_50,vsnprintf,0x148,"%f",
                     (this->super_Base).trainDataGT.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar10]);
          local_a8.first._M_dataplus._M_p = (pointer)&local_a8.first.field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c8._M_dataplus._M_p == &local_c8.field_2) {
            local_a8.first.field_2._8_8_ = local_c8.field_2._8_8_;
          }
          else {
            local_a8.first._M_dataplus._M_p = local_c8._M_dataplus._M_p;
          }
          local_a8.second._M_dataplus._M_p = (pointer)&local_a8.second.field_2;
          local_a8.first._M_string_length = local_c8._M_string_length;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p == &local_50.field_2) {
            local_a8.second.field_2._8_8_ = local_50.field_2._8_8_;
          }
          else {
            local_a8.second._M_dataplus._M_p = local_50._M_dataplus._M_p;
          }
          local_a8.second._M_string_length = local_50._M_string_length;
          __gnu_cxx::__to_xstring<std::__cxx11::string,char>
                    (&local_c8,vsnprintf,0x148,"%f",
                     (this->super_Base).trainDataGT.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar10]);
          pmVar3 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                   ::operator[](&this->priProb,&local_c8);
          local_58 = *pmVar3;
          dVar1 = *lmbda;
          pvVar6 = (this->xVal).
                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          lVar12 = *(long *)((long)&(pvVar6->super__Vector_base<double,_std::allocator<double>_>).
                                    _M_impl.super__Vector_impl_data + local_60 * 8);
          lVar11 = *(long *)((long)&(pvVar6->super__Vector_base<double,_std::allocator<double>_>).
                                    _M_impl.super__Vector_impl_data + local_60 * 8 + 8);
          pmVar3 = std::
                   map<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_double,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_double>_>_>
                   ::operator[]((map<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_double,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_double>_>_>
                                 *)(*(long *)&this->condProb + local_68),&local_a8);
          lVar11 = lVar11 - lVar12;
          lVar12 = lVar11 >> 3;
          auVar15._8_4_ = (int)(lVar11 >> 0x23);
          auVar15._0_8_ = lVar12;
          auVar15._12_4_ = 0x45300000;
          *pmVar3 = 1.0 / (dVar1 * ((auVar15._8_8_ - 1.9342813113834067e+25) +
                                   ((double)CONCAT44(0x43300000,(int)lVar12) - 4503599627370496.0))
                          + local_58) + *pmVar3;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
            operator_delete(local_c8._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8.second._M_dataplus._M_p != &local_a8.second.field_2) {
            operator_delete(local_a8.second._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8.first._M_dataplus._M_p != &local_a8.first.field_2) {
            operator_delete(local_a8.first._M_dataplus._M_p);
          }
          uVar10 = uVar10 + 1;
          pvVar5 = (this->super_Base).trainDataF.
                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pvVar6 = (this->super_Base).trainDataF.
                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          lVar9 = lVar9 + 0x18;
        } while (uVar10 < (ulong)(((long)pvVar6 - (long)pvVar5 >> 3) * -0x5555555555555555));
        uVar10 = (this->super_Base).indim;
      }
      local_100 = local_100 + 1;
    } while (local_100 < uVar10);
    if (uVar10 != 0) {
      uVar7 = 0;
      do {
        lVar9 = *(long *)&this->condProb + uVar7 * 0x30;
        p_Var13 = (_Rb_tree_node_base *)(lVar9 + 8);
        p_Var4 = *(_Rb_tree_node_base **)(lVar9 + 0x18);
        if (p_Var4 != p_Var13) {
          do {
            dVar1 = *lmbda;
            pmVar3 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                     ::operator[](&this->priProb,(key_type *)(p_Var4 + 2));
            pvVar6 = (this->xVal).
                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            lVar9 = (long)*(pointer *)
                           ((long)&pvVar6[uVar7].super__Vector_base<double,_std::allocator<double>_>
                                   ._M_impl.super__Vector_impl_data + 8) -
                    *(long *)&pvVar6[uVar7].super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data;
            lVar12 = lVar9 >> 3;
            auVar16._8_4_ = (int)(lVar9 >> 0x23);
            auVar16._0_8_ = lVar12;
            auVar16._12_4_ = 0x45300000;
            *(double *)(p_Var4 + 3) =
                 dVar1 / (((auVar16._8_8_ - 1.9342813113834067e+25) +
                          ((double)CONCAT44(0x43300000,(int)lVar12) - 4503599627370496.0)) * *lmbda
                         + *pmVar3) + *(double *)(p_Var4 + 3);
            p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4);
          } while (p_Var4 != p_Var13);
          uVar10 = (this->super_Base).indim;
        }
        uVar7 = uVar7 + 1;
      } while (uVar7 < uVar10);
    }
  }
  p_Var4 = *(_Rb_tree_node_base **)&this->field_0x118;
  if (p_Var4 != (_Rb_tree_node_base *)&this->field_0x108) {
    lVar9 = ((long)(this->yVal).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(this->yVal).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3) +
            ((long)(this->super_Base).trainDataF.
                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->super_Base).trainDataF.
                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
    auVar17._8_4_ = (int)((ulong)lVar9 >> 0x20);
    auVar17._0_8_ = lVar9;
    auVar17._12_4_ = 0x45300000;
    do {
      *(double *)(p_Var4 + 2) =
           (*(double *)(p_Var4 + 2) + *lmbda) /
           ((auVar17._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)lVar9) - 4503599627370496.0));
      p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4);
    } while (p_Var4 != (_Rb_tree_node_base *)&this->field_0x108);
  }
  return;
}

Assistant:

void NavieBayes::bayesEstim(const double& lmbda = 1.0){
    for(const auto& gt: trainDataGT){
        priProb[std::to_string(gt)] += 1.0;
    }
    for(unsigned long i=0;i<indim;++i){
        for(unsigned long j=0;j<trainDataF.size();++j)
        {
            auto cond = std::make_pair(std::to_string(trainDataF[j][i]), std::to_string(trainDataGT[j]));

            condProb[i][cond] += 1.0/(priProb[std::to_string(trainDataGT[j])]+lmbda*xVal[i].size());
        }
    }
    for(unsigned long i=0;i<indim;++i){
        for(auto& d:condProb[i]){
            d.second += lmbda/(priProb[d.first.second]+lmbda*xVal[i].size());
        }
    }

    for(auto& iter:priProb)
        iter.second = (iter.second+lmbda)/(double(trainDataF.size()+yVal.size()));
}